

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O3

int __thiscall Qclass::Train(Qclass *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint lastAction;
  int iVar4;
  int (*paiVar5) [50];
  ostream *poVar6;
  int iVar7;
  int lastState;
  double (*padVar8) [4];
  int new_state;
  int j;
  long lVar9;
  int i;
  int iVar10;
  long lVar11;
  int iVar12;
  int local_38;
  int local_34;
  
  createGrid(this);
  iVar2 = rand();
  iVar2 = iVar2 % 0x32;
  iVar3 = rand();
  iVar7 = this->goal_x * 0x32 + this->goal_y;
  paiVar5 = this->grid + iVar2;
  while (iVar3 = iVar3 % 0x32, (*paiVar5)[iVar3] == 1) {
    iVar2 = rand();
    iVar2 = iVar2 % 0x32;
    iVar3 = rand();
    paiVar5 = this->grid + iVar2;
  }
  new_state = iVar2 * 0x32 + iVar3;
  bVar1 = true;
  iVar4 = 0;
  local_38 = 0;
  local_34 = 0;
  do {
    iVar12 = new_state;
    if (iVar7 != 0) {
      lastAction = 0;
      lastState = 0;
      do {
        iVar10 = iVar2;
        iVar12 = iVar3;
        if (!bVar1) {
          if (lastAction == 3) {
            iVar12 = iVar3 + -1;
            new_state = iVar3 + iVar2 * 0x32 + -1;
            Qupdate(this,3,lastState,iVar2,iVar3,new_state);
            local_38 = iVar12;
            local_34 = iVar2;
          }
          else {
            if (lastAction == 0) {
              local_34 = iVar2 + 1;
            }
            if (lastAction == 1) {
              local_34 = iVar2 + -1;
            }
            if (lastAction < 2) {
              local_38 = iVar3;
            }
            iVar10 = local_34;
            iVar12 = local_38;
            if (lastAction == 2) {
              iVar10 = iVar2;
              iVar12 = iVar3 + 1;
            }
            new_state = iVar10 * 0x32 + iVar12;
            Qupdate(this,lastAction,lastState,iVar2,iVar3,new_state);
            local_38 = iVar12;
            local_34 = iVar10;
          }
        }
        lastAction = detAction(this,new_state);
        if (this->restart == true) {
          this->restart = false;
          iVar2 = rand();
          iVar3 = rand();
          while( true ) {
            iVar2 = iVar2 % 0x32;
            iVar3 = iVar3 % 0x32;
            if (this->grid[iVar2][iVar3] != 1) break;
            iVar2 = rand();
            iVar3 = rand();
          }
          new_state = iVar2 * 0x32 + iVar3;
          lastAction = detAction(this,new_state);
          bVar1 = true;
        }
        else {
          bVar1 = false;
          iVar2 = iVar10;
          iVar3 = iVar12;
        }
        iVar12 = iVar7;
        lastState = new_state;
      } while (new_state != iVar7);
    }
    new_state = iVar12;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 50000);
  padVar8 = this->Q;
  lVar11 = 0;
  do {
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
    lVar9 = 0;
    do {
      poVar6 = std::ostream::_M_insert<double>((*padVar8)[lVar9]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    lVar11 = lVar11 + 1;
    padVar8 = padVar8 + 1;
  } while (lVar11 != 0x9c4);
  return 0;
}

Assistant:

int Qclass::Train() {
  Qclass::createGrid();
  int initialTrial = 1;
  int new_x = 0;
  int action = 0;
  int new_y = 0;
  int new_state = 0;
  int start_x = rand() % 50;
  int start_y = rand() % 50;
  int goal_state = findState(goal_x, goal_y);
  if (grid[start_x][start_y] == 1) {
    while (grid[start_x][start_y] == 1) {
      start_x = rand() % 50;
      start_y = rand() % 50;
    }
  }
  int prev_x = start_x;
  int prev_y = start_y;
  int state = findState(start_x, start_y);
  for (int k = 0; k < 50000; k++) {
    int lastState = 0;
    int lastAction = 0;
    while (lastState != goal_state) {
      // Skips this loop for first run as there are no previous nodes
      if (initialTrial == 0) {
        if (lastAction == 0) {
          new_x = prev_x + 1;
          new_y = prev_y;
        }
        if (lastAction == 1) {
          new_x = prev_x - 1;
          new_y = prev_y;
        }
        if (lastAction == 2) {
          new_x = prev_x;
          new_y = prev_y + 1;
        }
        if (lastAction == 3) {
          new_x = prev_x;
          new_y = prev_y - 1;
        }
        new_state = findState(new_x, new_y);
        Qupdate(lastAction, lastState, prev_x, prev_y, new_state);
        prev_x = new_x;
        prev_y = new_y;
        state = findState(prev_x, prev_y);
      }
      action = detAction(state);
      lastState = state;
      lastAction = action;
      initialTrial = 0;
      // Reinitialize all the training data whenever a collision occurs
      if (restart == true) {
        restart = false;
        initialTrial = 1;
        int start_x = rand() % 50;
        int start_y = rand() % 50;
        if (grid[start_x][start_y] == 1) {
          while (grid[start_x][start_y] == 1) {
            start_x = rand() % 50;
            start_y = rand() % 50;
          }
        }
        prev_x = start_x;
        prev_y = start_y;
        state = findState(start_x, start_y);
        action = detAction(state);
        lastState = state;
        lastAction = action;
      }
    }
  }
  // Outputting the Q table for 2500 states and 4 actions
  for (int i = 0; i < 2500; i++) {
    std::cout << i << "  ";
    for (int j = 0; j < 4; j++) {
      std::cout << Q[i][j] << "  ";
    }
    std::cout << std::endl;
  }
  return 0;
}